

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking64.h
# Opt level: O0

void packforblock6_64(uint64_t base,uint64_t **pin,uint8_t **pw)

{
  ulong *puVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint64_t *in;
  uint64_t *pw64;
  uint8_t **pw_local;
  uint64_t **pin_local;
  uint64_t base_local;
  
  puVar1 = (ulong *)*pw;
  puVar2 = *pin;
  uVar3 = puVar2[10];
  uVar4 = puVar2[0xb];
  uVar5 = puVar2[0xc];
  uVar6 = puVar2[0xd];
  uVar7 = puVar2[0xe];
  uVar8 = puVar2[0xf];
  uVar9 = puVar2[0x10];
  uVar10 = puVar2[0x11];
  uVar11 = puVar2[0x12];
  uVar12 = puVar2[0x13];
  uVar13 = puVar2[0x14];
  uVar14 = puVar2[0x15];
  uVar15 = puVar2[0x15];
  uVar16 = puVar2[0x16];
  uVar17 = puVar2[0x17];
  uVar18 = puVar2[0x18];
  uVar19 = puVar2[0x19];
  uVar20 = puVar2[0x1a];
  uVar21 = puVar2[0x1b];
  uVar22 = puVar2[0x1c];
  uVar23 = puVar2[0x1d];
  uVar24 = puVar2[0x1e];
  uVar25 = puVar2[0x1f];
  *puVar1 = puVar2[10] - base << 0x3c |
            puVar2[9] - base << 0x36 |
            puVar2[8] - base << 0x30 |
            puVar2[7] - base << 0x2a |
            puVar2[6] - base << 0x24 |
            (puVar2[5] - base) * 0x40000000 |
            (puVar2[4] - base) * 0x1000000 |
            (puVar2[3] - base) * 0x40000 |
            (puVar2[2] - base) * 0x1000 | (puVar2[1] - base) * 0x40 | *puVar2 - base;
  puVar1[1] = uVar14 - base << 0x3e |
              uVar13 - base << 0x38 |
              uVar12 - base << 0x32 |
              uVar11 - base << 0x2c |
              uVar10 - base << 0x26 |
              uVar9 - base << 0x20 |
              (uVar8 - base) * 0x4000000 |
              (uVar7 - base) * 0x100000 |
              (uVar6 - base) * 0x4000 |
              (uVar5 - base) * 0x100 | (uVar4 - base) * 4 | uVar3 - base >> 4;
  puVar1[2] = uVar25 - base << 0x3a |
              uVar24 - base << 0x34 |
              uVar23 - base << 0x2e |
              uVar22 - base << 0x28 |
              uVar21 - base << 0x22 |
              (uVar20 - base) * 0x10000000 |
              (uVar19 - base) * 0x400000 |
              (uVar18 - base) * 0x10000 |
              (uVar17 - base) * 0x400 | (uVar16 - base) * 0x10 | uVar15 - base >> 2;
  *pin = *pin + 0x20;
  *pw = *pw + 0x18;
  return;
}

Assistant:

static void packforblock6_64(const uint64_t base, const uint64_t ** pin, uint8_t ** pw) {
  uint64_t * pw64 = *(uint64_t **) pw;
  const uint64_t * in = *pin;
  /* we are going to touch  3 64-bit words */ 
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  w0 = (in[0] - base);
  w0 |=  (in[1] - base) << 6;
  w0 |=  (in[2] - base) << 12;
  w0 |=  (in[3] - base) << 18;
  w0 |=  (in[4] - base) << 24;
  w0 |=  (in[5] - base) << 30;
  w0 |=  (in[6] - base) << 36;
  w0 |=  (in[7] - base) << 42;
  w0 |=  (in[8] - base) << 48;
  w0 |=  (in[9] - base) << 54;
  w0 |= (in[10] - base) << 60;
  w1 = (in[10] - base) >> 4;
  w1 |=  (in[11] - base) << 2;
  w1 |=  (in[12] - base) << 8;
  w1 |=  (in[13] - base) << 14;
  w1 |=  (in[14] - base) << 20;
  w1 |=  (in[15] - base) << 26;
  w1 |=  (in[16] - base) << 32;
  w1 |=  (in[17] - base) << 38;
  w1 |=  (in[18] - base) << 44;
  w1 |=  (in[19] - base) << 50;
  w1 |=  (in[20] - base) << 56;
  w1 |= (in[21] - base) << 62;
  w2 = (in[21] - base) >> 2;
  w2 |=  (in[22] - base) << 4;
  w2 |=  (in[23] - base) << 10;
  w2 |=  (in[24] - base) << 16;
  w2 |=  (in[25] - base) << 22;
  w2 |=  (in[26] - base) << 28;
  w2 |=  (in[27] - base) << 34;
  w2 |=  (in[28] - base) << 40;
  w2 |=  (in[29] - base) << 46;
  w2 |=  (in[30] - base) << 52;
  w2 |=  (in[31] - base) << 58;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  *pin += 32; /* we consumed 32 64-bit integers */ 
  *pw += 24; /* we used up 24 output bytes */ 
}